

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdsFile.cpp
# Opt level: O0

void __thiscall AdsFile::Write(AdsFile *this,size_t size,void *data)

{
  AdsDevice *this_00;
  type puVar1;
  long adsErrorCode;
  AdsException *this_01;
  long error;
  void *data_local;
  size_t size_local;
  AdsFile *this_local;
  
  this_00 = this->m_Route;
  puVar1 = std::unique_ptr<unsigned_int,_ResourceDeleter<unsigned_int>_>::operator*(&this->m_Handle)
  ;
  adsErrorCode = AdsDevice::ReadWriteReqEx2
                           (this_00,0x7b,*puVar1,0,(void *)0x0,size,data,(uint32_t *)0x0);
  if (adsErrorCode != 0) {
    this_01 = (AdsException *)__cxa_allocate_exception(0x30);
    AdsException::AdsException(this_01,adsErrorCode);
    __cxa_throw(this_01,&AdsException::typeinfo,AdsException::~AdsException);
  }
  return;
}

Assistant:

void AdsFile::Write(const size_t size, const void* data) const
{
    auto error = m_Route.ReadWriteReqEx2(SYSTEMSERVICE_FWRITE, *m_Handle, 0, nullptr, size, data, nullptr);
    if (error) {
        throw AdsException(error);
    }
}